

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

string * __thiscall
wabt::anon_unknown_0::CWriter::DefineLocalScopeName
          (string *__return_storage_ptr__,CWriter *this,string *name)

{
  string *extraout_RAX;
  string *psVar1;
  size_type in_R8;
  string_view sVar2;
  string_view name_00;
  size_type in_stack_ffffffffffffff98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  
  sVar2.size_ = in_stack_ffffffffffffff98;
  sVar2.data_ = (char *)0x1452f9;
  sVar2 = StripLeadingDollar(sVar2);
  name_00.size_ = in_R8;
  name_00.data_ = (char *)sVar2.size_;
  DefineName(__return_storage_ptr__,(CWriter *)&this->local_syms_,(SymbolSet *)sVar2.data_,name_00);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_60,name,__return_storage_ptr__);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&this->local_sym_map_,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.second._M_dataplus._M_p != &local_60.second.field_2) {
    operator_delete(local_60.second._M_dataplus._M_p);
  }
  psVar1 = (string *)&local_60.first.field_2;
  if ((string *)local_60.first._M_dataplus._M_p != psVar1) {
    operator_delete(local_60.first._M_dataplus._M_p);
    psVar1 = extraout_RAX;
  }
  return psVar1;
}

Assistant:

std::string CWriter::DefineLocalScopeName(const std::string& name) {
  std::string unique = DefineName(&local_syms_, StripLeadingDollar(name));
  local_sym_map_.insert(SymbolMap::value_type(name, unique));
  return unique;
}